

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

value_type * __thiscall
google::
dense_hashtable<std::pair<char_const,std::vector<CMString,std::allocator<CMString>>*>,char,std::hash<char>,google::dense_hash_map<char,std::vector<CMString,std::allocator<CMString>>*,std::hash<char>,std::equal_to<char>,google::libc_allocator_with_realloc<std::pair<char_const,std::vector<CMString,std::allocator<CMString>>*>>>::SelectKey,google::dense_hash_map<char,std::vector<CMString,std::allocator<CMString>>*,std::hash<char>,std::equal_to<char>,google::libc_allocator_with_realloc<std::pair<char_const,std::vector<CMString,std::allocator<CMString>>*>>>::SetKey,std::equal_to<char>,google::libc_allocator_with_realloc<std::pair<char_const,std::vector<CMString,std::allocator<CMString>>*>>>
::
find_or_insert<google::dense_hash_map<char,std::vector<CMString,std::allocator<CMString>>*,std::hash<char>,std::equal_to<char>,google::libc_allocator_with_realloc<std::pair<char_const,std::vector<CMString,std::allocator<CMString>>*>>>::DefaultValue>
          (dense_hashtable<std::pair<char_const,std::vector<CMString,std::allocator<CMString>>*>,char,std::hash<char>,google::dense_hash_map<char,std::vector<CMString,std::allocator<CMString>>*,std::hash<char>,std::equal_to<char>,google::libc_allocator_with_realloc<std::pair<char_const,std::vector<CMString,std::allocator<CMString>>*>>>::SelectKey,google::dense_hash_map<char,std::vector<CMString,std::allocator<CMString>>*,std::hash<char>,std::equal_to<char>,google::libc_allocator_with_realloc<std::pair<char_const,std::vector<CMString,std::allocator<CMString>>*>>>::SetKey,std::equal_to<char>,google::libc_allocator_with_realloc<std::pair<char_const,std::vector<CMString,std::allocator<CMString>>*>>>
           *this,key_type *key)

{
  bool bVar1;
  pair<unsigned_long,_unsigned_long> pVar2;
  pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*> local_48;
  pair<google::dense_hashtable_iterator<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>,_bool>
  local_38;
  
  if ((this[0x19] ==
       (dense_hashtable<std::pair<char_const,std::vector<CMString,std::allocator<CMString>>*>,char,std::hash<char>,google::dense_hash_map<char,std::vector<CMString,std::allocator<CMString>>*,std::hash<char>,std::equal_to<char>,google::libc_allocator_with_realloc<std::pair<char_const,std::vector<CMString,std::allocator<CMString>>*>>>::SelectKey,google::dense_hash_map<char,std::vector<CMString,std::allocator<CMString>>*,std::hash<char>,std::equal_to<char>,google::libc_allocator_with_realloc<std::pair<char_const,std::vector<CMString,std::allocator<CMString>>*>>>::SetKey,std::equal_to<char>,google::libc_allocator_with_realloc<std::pair<char_const,std::vector<CMString,std::allocator<CMString>>*>>>
        )0x1) &&
     ((dense_hashtable<std::pair<char_const,std::vector<CMString,std::allocator<CMString>>*>,char,std::hash<char>,google::dense_hash_map<char,std::vector<CMString,std::allocator<CMString>>*,std::hash<char>,std::equal_to<char>,google::libc_allocator_with_realloc<std::pair<char_const,std::vector<CMString,std::allocator<CMString>>*>>>::SelectKey,google::dense_hash_map<char,std::vector<CMString,std::allocator<CMString>>*,std::hash<char>,std::equal_to<char>,google::libc_allocator_with_realloc<std::pair<char_const,std::vector<CMString,std::allocator<CMString>>*>>>::SetKey,std::equal_to<char>,google::libc_allocator_with_realloc<std::pair<char_const,std::vector<CMString,std::allocator<CMString>>*>>>
       )*key == this[0x40])) {
    __assert_fail("(!settings.use_empty() || !equals(key, get_key(val_info.emptyval))) && \"Inserting the empty key\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/sparsehash/src/sparsehash/internal/densehashtable.h"
                  ,0x3df,
                  "value_type &google::dense_hashtable<std::pair<const char, std::vector<CMString> *>, char, std::hash<char>, google::dense_hash_map<char, std::vector<CMString> *>::SelectKey, google::dense_hash_map<char, std::vector<CMString> *>::SetKey, std::equal_to<char>, google::libc_allocator_with_realloc<std::pair<const char, std::vector<CMString> *>>>::find_or_insert(const key_type &) [Value = std::pair<const char, std::vector<CMString> *>, Key = char, HashFcn = std::hash<char>, ExtractKey = google::dense_hash_map<char, std::vector<CMString> *>::SelectKey, SetKey = google::dense_hash_map<char, std::vector<CMString> *>::SetKey, EqualKey = std::equal_to<char>, Alloc = google::libc_allocator_with_realloc<std::pair<const char, std::vector<CMString> *>>, DefaultValue = google::dense_hash_map<char, std::vector<CMString> *>::DefaultValue]"
                 );
  }
  if ((this[0x1a] !=
       (dense_hashtable<std::pair<char_const,std::vector<CMString,std::allocator<CMString>>*>,char,std::hash<char>,google::dense_hash_map<char,std::vector<CMString,std::allocator<CMString>>*,std::hash<char>,std::equal_to<char>,google::libc_allocator_with_realloc<std::pair<char_const,std::vector<CMString,std::allocator<CMString>>*>>>::SelectKey,google::dense_hash_map<char,std::vector<CMString,std::allocator<CMString>>*,std::hash<char>,std::equal_to<char>,google::libc_allocator_with_realloc<std::pair<char_const,std::vector<CMString,std::allocator<CMString>>*>>>::SetKey,std::equal_to<char>,google::libc_allocator_with_realloc<std::pair<char_const,std::vector<CMString,std::allocator<CMString>>*>>>
        )0x0) &&
     ((dense_hashtable<std::pair<char_const,std::vector<CMString,std::allocator<CMString>>*>,char,std::hash<char>,google::dense_hash_map<char,std::vector<CMString,std::allocator<CMString>>*,std::hash<char>,std::equal_to<char>,google::libc_allocator_with_realloc<std::pair<char_const,std::vector<CMString,std::allocator<CMString>>*>>>::SelectKey,google::dense_hash_map<char,std::vector<CMString,std::allocator<CMString>>*,std::hash<char>,std::equal_to<char>,google::libc_allocator_with_realloc<std::pair<char_const,std::vector<CMString,std::allocator<CMString>>*>>>::SetKey,std::equal_to<char>,google::libc_allocator_with_realloc<std::pair<char_const,std::vector<CMString,std::allocator<CMString>>*>>>
       )*key == this[0x20])) {
    __assert_fail("(!settings.use_deleted() || !equals(key, key_info.delkey)) && \"Inserting the deleted key\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/sparsehash/src/sparsehash/internal/densehashtable.h"
                  ,0x3e1,
                  "value_type &google::dense_hashtable<std::pair<const char, std::vector<CMString> *>, char, std::hash<char>, google::dense_hash_map<char, std::vector<CMString> *>::SelectKey, google::dense_hash_map<char, std::vector<CMString> *>::SetKey, std::equal_to<char>, google::libc_allocator_with_realloc<std::pair<const char, std::vector<CMString> *>>>::find_or_insert(const key_type &) [Value = std::pair<const char, std::vector<CMString> *>, Key = char, HashFcn = std::hash<char>, ExtractKey = google::dense_hash_map<char, std::vector<CMString> *>::SelectKey, SetKey = google::dense_hash_map<char, std::vector<CMString> *>::SetKey, EqualKey = std::equal_to<char>, Alloc = google::libc_allocator_with_realloc<std::pair<const char, std::vector<CMString> *>>, DefaultValue = google::dense_hash_map<char, std::vector<CMString> *>::DefaultValue]"
                 );
  }
  pVar2 = dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
          ::find_position((dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
                           *)this,key);
  if (pVar2.first == 0xffffffffffffffff) {
    bVar1 = dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
            ::resize_delta((dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
                            *)this,1);
    if (bVar1) {
      local_48.first = *key;
      local_48.second = (vector<CMString,_std::allocator<CMString>_> *)0x0;
      dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
      ::insert_noresize(&local_38,
                        (dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
                         *)this,&local_48);
    }
    else {
      local_48.first = *key;
      local_48.second = (vector<CMString,_std::allocator<CMString>_> *)0x0;
      dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
      ::insert_at(&local_38.first,
                  (dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
                   *)this,&local_48,pVar2.second);
    }
  }
  else {
    local_38.first.pos = (pointer)(pVar2.first * 0x10 + *(long *)(this + 0x50));
  }
  return local_38.first.pos;
}

Assistant:

value_type& find_or_insert(const key_type& key) {
    // First, double-check we're not inserting emptykey or delkey
    assert((!settings.use_empty() || !equals(key, get_key(val_info.emptyval)))
           && "Inserting the empty key");
    assert((!settings.use_deleted() || !equals(key, key_info.delkey))
           && "Inserting the deleted key");
    const std::pair<size_type,size_type> pos = find_position(key);
    DefaultValue default_value;
    if ( pos.first != ILLEGAL_BUCKET) {  // object was already there
      return table[pos.first];
    } else if (resize_delta(1)) {        // needed to rehash to make room
      // Since we resized, we can't use pos, so recalculate where to insert.
      return *insert_noresize(default_value(key)).first;
    } else {                             // no need to rehash, insert right here
      return *insert_at(default_value(key), pos.second);
    }
  }